

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O2

char * google::protobuf::internal::TcParser::FastGtS2
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  undefined4 uVar1;
  undefined4 uVar2;
  ushort uVar3;
  TcParseTableBase *table_00;
  bool bVar4;
  uint uVar5;
  uint *puVar6;
  MessageLite **ppMVar7;
  MessageLite *msg_00;
  ulong uVar8;
  Nonnull<const_char_*> failure_msg;
  ushort *puVar9;
  char *pcVar10;
  ushort *puVar11;
  Arena *arena;
  int iVar12;
  ushort *local_48 [2];
  int local_34;
  
  if (data.field_0._0_2_ != 0) {
    pcVar10 = MiniParse(msg,ptr,ctx,data,table,hasbits);
    return pcVar10;
  }
  uVar3 = *(ushort *)ptr;
  if ((ulong)table->has_bits_offset != 0) {
    puVar6 = RefAt<unsigned_int>(msg,(ulong)table->has_bits_offset);
    *puVar6 = *puVar6 | (uint)hasbits | (uint)(1L << (data.field_0._2_1_ & 0x3f));
  }
  ppMVar7 = RefAt<google::protobuf::MessageLite*>(msg,(ulong)data.field_0 >> 0x30);
  table_00 = *(TcParseTableBase **)
              ((long)&table->has_bits_offset +
              ((ulong)data.field_0 >> 0x18 & 0xff) * 8 + (ulong)table->aux_offset);
  msg_00 = *ppMVar7;
  if (msg_00 == (MessageLite *)0x0) {
    arena = (Arena *)(msg->_internal_metadata_).ptr_;
    if (((ulong)arena & 1) != 0) {
      arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
    }
    msg_00 = ClassData::New(table_00->class_data,arena);
    *ppMVar7 = msg_00;
  }
  iVar12 = ctx->depth_;
  local_34 = iVar12 + -1;
  ctx->depth_ = local_34;
  if (iVar12 < 1) {
    return (char *)0x0;
  }
  local_48[0] = (ushort *)(ptr + 2);
  iVar12 = ctx->group_depth_ + 1;
  ctx->group_depth_ = iVar12;
  while (bVar4 = ParseContext::Done(ctx,(char **)local_48), !bVar4) {
    uVar5 = (uint)table_00->fast_idx_mask & (uint)*local_48[0];
    if ((uVar5 & 7) != 0) {
      protobuf_assumption_failed
                ("(idx & 7) == 0",
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
                 ,0x452);
    }
    uVar8 = (ulong)(uVar5 & 0xfffffff8);
    local_48[0] = (ushort *)
                  (**(code **)(&table_00[1].has_bits_offset + uVar8))
                            (msg_00,local_48[0],ctx,
                             (ulong)*local_48[0] ^
                             *(ulong *)(&table_00[1].fast_idx_mask + uVar8 * 2),table_00,0);
    if ((local_48[0] == (ushort *)0x0) || ((ctx->super_EpsCopyInputStream).last_tag_minus_1_ != 0))
    break;
  }
  if ((table_00->field_0x9 & 1) == 0) {
    puVar11 = local_48[0];
    if (local_48[0] == (ushort *)0x0) {
      VerifyHasBitConsistency(msg_00,table_00);
      puVar11 = local_48[0];
      goto LAB_0026c27a;
    }
  }
  else {
    puVar11 = (ushort *)(*table_00->post_loop_handler)(msg_00,(char *)local_48[0],ctx);
LAB_0026c27a:
    if (puVar11 == (ushort *)0x0) {
      puVar11 = (ushort *)0x0;
      goto LAB_0026c1fa;
    }
  }
  failure_msg = absl::lts_20250127::log_internal::Check_EQImpl
                          (local_34,ctx->depth_,"old_depth == depth_");
  if (failure_msg == (Nullable<const_char_*>)0x0) {
    failure_msg = absl::lts_20250127::log_internal::Check_EQImpl
                            (iVar12,ctx->group_depth_,"old_group_depth == group_depth_");
    if (failure_msg == (Nullable<const_char_*>)0x0) {
LAB_0026c1fa:
      uVar1 = ctx->depth_;
      uVar2 = ctx->group_depth_;
      ctx->depth_ = uVar1 + 1;
      ctx->group_depth_ = uVar2 + -1;
      uVar5 = (ctx->super_EpsCopyInputStream).last_tag_minus_1_;
      (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = 0;
      puVar9 = (ushort *)0x0;
      if (uVar5 == (int)(char)uVar3 + (uint)uVar3 >> 1) {
        puVar9 = puVar11;
      }
      return (char *)puVar9;
    }
    iVar12 = 0x492;
  }
  else {
    iVar12 = 0x491;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)local_48,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/parse_context.h"
             ,iVar12,failure_msg);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_48);
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::FastGtS2(PROTOBUF_TC_PARAM_DECL) {
  PROTOBUF_MUSTTAIL return SingularParseMessageAuxImpl<uint16_t, true, true>(
      PROTOBUF_TC_PARAM_PASS);
}